

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__2,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  Arg *in_R9;
  string_view format;
  Arg AStack_78;
  ulong local_48;
  long local_40;
  
  local_40 = *(long *)(*(long *)(**(long **)this + 0x20) + 0x10);
  local_48 = (ulong)*(ushort *)(local_40 + 2);
  local_40 = ~local_48 + local_40;
  substitute_internal::Arg::Arg(&AStack_78,*(int *)(**(long **)this + 4));
  format._M_str = (char *)&local_48;
  format._M_len = (size_t)"\"$0\" does not declare $1 as an extension number.";
  Substitute_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)0x30,format,&AStack_78,in_R9);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}